

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::pkgConfigFileName
          (QString *__return_storage_ptr__,MakefileGenerator *this,bool fixify)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  qsizetype qVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  ProKey local_108;
  QString local_d0;
  QString local_b8;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_PKGCONFIG_FILE");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::toQString(__return_storage_ptr__,&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((__return_storage_ptr__->d).size == 0) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)&local_98,"TARGET");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_98);
    ProString::toQString((QString *)&local_108,&local_68);
    pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar7 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_108.super_ProString.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_108.super_ProString.m_string.d.ptr;
    qVar6 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_108.super_ProString.m_string.d.size;
    local_108.super_ProString.m_string.d.d = (Data *)pQVar2;
    local_108.super_ProString.m_string.d.ptr = pcVar7;
    local_108.super_ProString.m_string.d.size = qVar6;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar5 = QString::lastIndexOf
                      ((QString *)__return_storage_ptr__,0x2e2bf0,
                       (CaseSensitivity)(__return_storage_ptr__->d).size);
    if (iVar5 != -1) {
      QString::right(&local_68.m_string,__return_storage_ptr__,
                     ~(long)iVar5 + (__return_storage_ptr__->d).size);
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar7 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.m_string.d.size;
      local_68.m_string.d.d = (Data *)pQVar2;
      local_68.m_string.d.ptr = pcVar7;
      local_68.m_string.d.size = qVar6;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
    QVar8.m_data = (storage_type *)0x3;
    QVar8.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar8);
    local_98.m_string.d.d = local_68.m_string.d.d;
    local_98.m_string.d.ptr = local_68.m_string.d.ptr;
    local_98.m_string.d.size = local_68.m_string.d.size;
    cVar3 = QString::startsWith((QString *)__return_storage_ptr__,(CaseSensitivity)&local_98);
    if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar3 != '\0') {
      QString::mid((longlong)&local_68,(longlong)__return_storage_ptr__);
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar7 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.m_string.d.size;
      local_68.m_string.d.size = qVar6;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_68.m_string.d.d = (Data *)pQVar2;
          local_68.m_string.d.ptr = pcVar7;
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
    local_68.m_string.d.ptr = (__return_storage_ptr__->d).ptr;
    local_68.m_string.d.d = (Data *)(__return_storage_ptr__->d).size;
    qVar6 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x2e,0,CaseSensitive);
    if ((int)qVar6 != -1) {
      QString::left(&local_68.m_string,__return_storage_ptr__,(long)(int)qVar6);
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar7 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.m_string.d.size;
      local_68.m_string.d.d = (Data *)pQVar2;
      local_68.m_string.d.ptr = pcVar7;
      local_68.m_string.d.size = qVar6;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
  }
  QString::append((QString *)__return_storage_ptr__);
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)&local_98,"QMAKE_PKGCONFIG_DESTDIR");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_98);
  ProString::toQString(&local_b8,&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_b8.d.size != (undefined1 *)0x0) {
    cVar3 = QString::endsWith((QString *)&local_b8,0x2e2bf0);
    if (cVar3 == '\0') {
      pcVar7 = Option::dir_sep.d.ptr;
      if (Option::dir_sep.d.ptr == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)pcVar7);
    }
    pcVar7 = local_b8.d.ptr;
    if (local_b8.d.ptr == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)pcVar7);
  }
  if (fixify) {
    cVar3 = QDir::isRelativePath((QString *)__return_storage_ptr__);
    if (cVar3 == '\0') {
      bVar4 = false;
    }
    else {
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)&local_68,"DESTDIR");
      bVar4 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_68);
      bVar4 = !bVar4;
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (bVar4) {
      pQVar1 = this->project;
      ProKey::ProKey(&local_108,"DESTDIR");
      QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,&local_108);
      ProString::toQString(&local_d0,&local_98);
      if (local_d0.d.ptr == (char16_t *)0x0) {
        local_d0.d.ptr = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)local_d0.d.ptr);
      if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_108.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_108.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
    }
    fileFixify(&local_98.m_string,this,__return_storage_ptr__,(FileFixifyTypes)0x3,true);
    pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar7 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_98.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_98.m_string.d.ptr;
    qVar6 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_98.m_string.d.size;
    local_98.m_string.d.d = (Data *)pQVar2;
    local_98.m_string.d.ptr = pcVar7;
    local_98.m_string.d.size = qVar6;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString
MakefileGenerator::pkgConfigFileName(bool fixify)
{
    QString ret = project->first("QMAKE_PKGCONFIG_FILE").toQString();
    if (ret.isEmpty()) {
        ret = project->first("TARGET").toQString();
        int slsh = ret.lastIndexOf(Option::dir_sep);
        if (slsh != -1)
            ret = ret.right(ret.size() - slsh - 1);
        if (ret.startsWith("lib"))
            ret = ret.mid(3);
        int dot = ret.indexOf('.');
        if (dot != -1)
            ret = ret.left(dot);
    }
    ret += Option::pkgcfg_ext;
    QString subdir = project->first("QMAKE_PKGCONFIG_DESTDIR").toQString();
    if(!subdir.isEmpty()) {
        // initOutPaths() appends dir_sep, but just to be safe..
        if (!subdir.endsWith(Option::dir_sep))
            ret.prepend(Option::dir_sep);
        ret.prepend(subdir);
    }
    if(fixify) {
        if(QDir::isRelativePath(ret) && !project->isEmpty("DESTDIR"))
            ret.prepend(project->first("DESTDIR").toQString());
        ret = fileFixify(ret, FileFixifyBackwards);
    }
    return ret;
}